

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O1

void __thiscall BigInteger::BigInteger(BigInteger *this,string *s)

{
  byte bVar1;
  iterator iVar2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  runtime_error *this_00;
  pointer puVar6;
  pointer pcVar7;
  uint temp;
  uint local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  *(undefined8 *)
   ((long)&(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c = 0;
  if (s->_M_string_length != 0) {
    pcVar7 = (s->_M_dataplus)._M_p + s->_M_string_length;
    iVar5 = 1;
    do {
      bVar1 = pcVar7[-1];
      if (bVar1 != 0x2b) {
        if (bVar1 == 0x2d) {
          this->negative = true;
        }
        else {
          if ((byte)(bVar1 - 0x3a) < 0xf6) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_48,"Invalid integer: ",s);
            std::runtime_error::runtime_error(this_00,(string *)&local_48);
            *(undefined ***)this_00 = &PTR__runtime_error_00160d40;
            __cxa_throw(this_00,&invalid_number_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_4c = (bVar1 - 0x30) * iVar5 + local_4c;
          iVar5 = iVar5 * 10;
          if (iVar5 == 1000000000) {
            iVar2._M_current =
                 (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&local_4c);
            }
            else {
              *iVar2._M_current = local_4c;
              (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            local_4c = 0;
            iVar5 = 1;
          }
        }
      }
      pcVar7 = pcVar7 + -1;
    } while (pcVar7 != (s->_M_dataplus)._M_p);
  }
  iVar5 = std::__cxx11::string::compare((char *)s);
  if (iVar5 == 0) {
    local_4c = 1;
  }
  iVar2._M_current =
       (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&local_4c);
  }
  else {
    *iVar2._M_current = local_4c;
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  puVar3 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar4 != puVar3 && (puVar6 = puVar4 + -1, *puVar6 == 0))) {
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
    puVar4 = puVar6;
  }
  if (puVar3 == puVar4) {
    this->negative = false;
  }
  return;
}

Assistant:

BigInteger::BigInteger(const std::string &s): digits(), negative(false)
{
    unsigned temp = 0;
    unsigned pow = 1;
    for(auto i = s.crbegin(); i != s.crend(); ++i)
    {
        if(*i == '-' || *i == '+')
        {
            if(*i == '-')
                negative = true;
            continue;
        }
        if(*i < '0' || *i > '9')
            throw invalid_number_error("Invalid integer: " + s);
        temp += pow * (*i - '0');
        pow *= 10;
        if(pow == BLOCK_MOD)
        {
            pow = 1;
            digits.push_back(temp);
            temp = 0;
        }
    }
    if(s == "-")
        temp = 1;
    digits.push_back(temp);
    normalize();
}